

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

OrderedParamAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedParamAssignmentSyntax,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  OrderedParamAssignmentSyntax *pOVar1;
  
  pOVar1 = (OrderedParamAssignmentSyntax *)allocate(this,0x20,8);
  (pOVar1->super_ParamAssignmentSyntax).super_SyntaxNode.kind = OrderedParamAssignment;
  (pOVar1->super_ParamAssignmentSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pOVar1->super_ParamAssignmentSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pOVar1->expr).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pOVar1;
  return pOVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }